

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)8>_> *
vkt::BindingModel::anon_unknown_1::ComputeInstanceResultBuffer::createResultBuffer
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,DeviceInterface *vki,
          VkDevice device,Allocator *allocator,
          MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *outAllocation)

{
  Handle<(vk::HandleType)8> *pHVar1;
  Allocation *pAVar2;
  void *pvVar3;
  VkDeviceMemory memory;
  VkDeviceSize offset_00;
  ulong local_b0;
  size_t offset;
  void *mapPtr;
  float clearValue;
  deUint32 local_8c;
  deUint64 local_88;
  undefined1 local_80 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> allocation;
  undefined1 auStack_68 [8];
  VkBufferCreateInfo createInfo;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *outAllocation_local;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  Move<vk::Handle<(vk::HandleType)8>_> *buffer;
  
  createInfo.usage = 0;
  createInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  createInfo.pNext = (void *)0x0;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.queueFamilyIndexCount = 0;
  createInfo._44_4_ = 0;
  auStack_68 = (undefined1  [8])0xc;
  createInfo.flags = 0x40;
  createInfo._20_4_ = 0;
  createInfo.size = 0x20;
  allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._15_1_ = 0
  ;
  createInfo.pQueueFamilyIndices = (deUint32 *)outAllocation;
  ::vk::createBuffer(__return_storage_ptr__,vki,device,(VkBufferCreateInfo *)auStack_68,
                     (VkAllocationCallbacks *)0x0);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_88 = pHVar1->m_internal;
  local_8c = ::vk::MemoryRequirement::HostVisible.m_flags;
  allocateAndBindObjectMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_80,vki,device,
             allocator,(VkBuffer)local_88,::vk::MemoryRequirement::HostVisible);
  mapPtr._0_4_ = 0xbf800000;
  pAVar2 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_80);
  pvVar3 = ::vk::Allocation::getHostPtr(pAVar2);
  for (local_b0 = 0; local_b0 < 0x40; local_b0 = local_b0 + 4) {
    ::deMemcpy((void *)((long)pvVar3 + local_b0),&mapPtr,4);
  }
  pAVar2 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_80);
  memory = ::vk::Allocation::getMemory(pAVar2);
  pAVar2 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_80);
  offset_00 = ::vk::Allocation::getOffset(pAVar2);
  ::vk::flushMappedMemoryRange(vki,device,memory,offset_00,0x40);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             createInfo.pQueueFamilyIndices,
             (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_80);
  allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._15_1_ = 1
  ;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_80);
  if ((allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
       _15_1_ & 1) == 0) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkBuffer> ComputeInstanceResultBuffer::createResultBuffer (const vk::DeviceInterface&		vki,
																		vk::VkDevice					device,
																		vk::Allocator&					allocator,
																		de::MovePtr<vk::Allocation>*	outAllocation)
{
	const vk::VkBufferCreateInfo	createInfo	=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
		DE_NULL,
		0u,											// flags
		(vk::VkDeviceSize)DATA_SIZE,				// size
		vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT,		// usage
		vk::VK_SHARING_MODE_EXCLUSIVE,				// sharingMode
		0u,											// queueFamilyCount
		DE_NULL,									// pQueueFamilyIndices
	};
	vk::Move<vk::VkBuffer>			buffer		(vk::createBuffer(vki, device, &createInfo));
	de::MovePtr<vk::Allocation>		allocation	(allocateAndBindObjectMemory(vki, device, allocator, *buffer, vk::MemoryRequirement::HostVisible));
	const float						clearValue	= -1.0f;
	void*							mapPtr		= allocation->getHostPtr();

	for (size_t offset = 0; offset < DATA_SIZE; offset += sizeof(float))
		deMemcpy(((deUint8*)mapPtr) + offset, &clearValue, sizeof(float));

	flushMappedMemoryRange(vki, device, allocation->getMemory(), allocation->getOffset(), (vk::VkDeviceSize)DATA_SIZE);

	*outAllocation = allocation;
	return buffer;
}